

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void write_sms_palette_file(Config config,char *filename,Image *input_image)

{
  byte bVar1;
  byte bVar2;
  ostream *poVar3;
  byte bVar4;
  byte bVar5;
  long lVar6;
  uint8_t c;
  char buf [3];
  ofstream out;
  
  std::ofstream::ofstream(&out);
  std::ofstream::open((char *)&out,(_Ios_Openmode)filename);
  if (config.output_bin == false) {
    std::operator<<((ostream *)&out,".db");
  }
  for (lVar6 = 10; lVar6 != 0x3a; lVar6 = lVar6 + 3) {
    bVar1 = *(byte *)((long)input_image->palette + lVar6 + -10);
    if (bVar1 < 0x38) {
      bVar2 = 0;
    }
    else {
      bVar2 = 1;
      if (0x79 < bVar1) {
        bVar2 = bVar1 < 0xbc ^ 3;
      }
    }
    bVar1 = *(byte *)((long)(input_image->palette + -3) + lVar6);
    if (bVar1 < 0x38) {
      bVar4 = 0;
    }
    else {
      bVar4 = 4;
      if (0x79 < bVar1) {
        bVar4 = (0xbb < bVar1) << 2 | 8;
      }
    }
    bVar1 = *(byte *)((long)input_image->palette + lVar6 + -8);
    if (bVar1 < 0x38) {
      bVar5 = 0;
    }
    else {
      bVar5 = 0x10;
      if (0x79 < bVar1) {
        bVar5 = (0xbb < bVar1) << 4 | 0x20;
      }
    }
    c = bVar4 | bVar2 | bVar5;
    if (config.output_bin == false) {
      sprintf(buf,"%02X",(ulong)c);
      poVar3 = std::operator<<((ostream *)&out," $");
      std::operator<<(poVar3,buf);
    }
    else {
      std::ostream::write((char *)&out,(long)&c);
    }
  }
  if (config.output_bin == false) {
    std::operator<<((ostream *)&out,"\n");
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&out);
  return;
}

Assistant:

void write_sms_palette_file(Config config, const char *filename, Image *input_image) {
    std::ofstream out;
    out.open(filename, config.output_bin ?
        std::ofstream::binary : std::ofstream::out);

    if (!config.output_bin) out << ".db";

    for (int i = 0; i < MAX_COLOURS; i++) {
        uint8_t c = (convert_colour_channel_to_2bit((uint8_t) input_image->palette[i].red)
                   | (convert_colour_channel_to_2bit((uint8_t) input_image->palette[i].green) << 2)
                   | (convert_colour_channel_to_2bit((uint8_t) input_image->palette[i].blue) << 4));

        if (!config.output_bin) {
            char buf[3];
            sprintf(buf, "%02X", c);
            out << " $" << buf;
        } else out.write((const char*)&c, 1);
    }
    if (!config.output_bin) out << "\n";

    out.close();
}